

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O3

bool __thiscall
cmWhileFunctionBlocker::IsFunctionBlocked
          (cmWhileFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  long *plVar4;
  _Elt_pointer pvVar5;
  bool bVar6;
  int iVar7;
  cmListFileArgument *arg;
  pointer pcVar8;
  pointer lff_00;
  pointer *ppbVar9;
  bool bVar10;
  MessageType messageType;
  string err;
  string errorString;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *__range6;
  cmListFileContext execContext;
  cmConditionEvaluator conditionEvaluator;
  MessageType local_20c;
  cmMakefile *local_208;
  string local_200;
  string local_1e0;
  undefined1 local_1c0 [16];
  _Elt_pointer pvStack_1b0;
  _Elt_pointer local_1a8;
  cmExecutionStatus *local_1a0;
  _Elt_pointer local_198;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *local_190;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  _Base_ptr local_158;
  _Elt_pointer local_148 [2];
  _Base_ptr local_138;
  undefined1 local_130 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Base_ptr local_f0;
  undefined1 local_e8 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Base_ptr local_a8;
  cmConditionEvaluator local_a0;
  
  iVar7 = std::__cxx11::string::compare((char *)lff);
  if (iVar7 == 0) {
    this->Depth = this->Depth + 1;
  }
  else {
    iVar7 = std::__cxx11::string::compare((char *)lff);
    if (iVar7 == 0) {
      if (this->Depth == 0) {
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)local_1c0,(cmFunctionBlocker *)mf,(cmListFileFunction *)this);
        bVar10 = (_Map_pointer)local_1c0._0_8_ != (_Map_pointer)0x0;
        if (!bVar10) {
          return bVar10;
        }
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        local_1e0._M_string_length = 0;
        local_1e0.field_2._M_local_buf[0] = '\0';
        local_1a8 = (_Elt_pointer)0x0;
        local_1c0._8_8_ = (_Elt_pointer)0x0;
        pvStack_1b0 = (_Elt_pointer)0x0;
        local_190 = &this->Args;
        cmMakefile::ExpandArguments
                  (mf,local_190,
                   (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
                   (local_1c0 + 8),(char *)0x0);
        local_178._0_8_ = local_188 + 0x20;
        pcVar1 = (this->super_cmFunctionBlocker).StartingContext.Name._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_188 + 0x10),pcVar1,
                   pcVar1 + (this->super_cmFunctionBlocker).StartingContext.Name._M_string_length);
        local_158 = (_Base_ptr)local_148;
        pcVar1 = (this->super_cmFunctionBlocker).StartingContext.FilePath._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,pcVar1,
                   pcVar1 + (this->super_cmFunctionBlocker).StartingContext.FilePath.
                            _M_string_length);
        local_138 = (_Base_ptr)(this->super_cmFunctionBlocker).StartingContext.Line;
        local_e8._0_8_ = local_e8 + 0x10;
        local_e8._8_8_ = 0;
        local_e8[0x10] = '\0';
        local_e8._32_8_ = local_e8 + 0x30;
        local_e8._40_8_ = (_Base_ptr)0x0;
        local_b8._M_local_buf[0] = '\0';
        local_a8 = local_138;
        cmCommandContext::cmCommandName::operator=
                  ((cmCommandName *)local_e8,(string *)(local_188 + 0x10));
        pcVar1 = (this->super_cmFunctionBlocker).StartingContext.Name._M_dataplus._M_p;
        local_130._0_8_ = (_Hash_node_base *)(local_130 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_130,pcVar1,
                   pcVar1 + (this->super_cmFunctionBlocker).StartingContext.Name._M_string_length);
        pcVar1 = (this->super_cmFunctionBlocker).StartingContext.FilePath._M_dataplus._M_p;
        local_110._M_p = (pointer)&local_100;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,pcVar1,
                   pcVar1 + (this->super_cmFunctionBlocker).StartingContext.FilePath.
                            _M_string_length);
        local_f0 = (_Base_ptr)(this->super_cmFunctionBlocker).StartingContext.Line;
        cmMakefile::GetBacktrace((cmMakefile *)local_188,(cmCommandContext *)mf);
        cmConditionEvaluator::cmConditionEvaluator
                  (&local_a0,mf,(cmListFileContext *)local_130,(cmListFileBacktrace *)local_188);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_p != &local_100) {
          operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
        }
        if ((_Hash_node_base *)local_130._0_8_ != (_Hash_node_base *)(local_130 + 0x10)) {
          operator_delete((void *)local_130._0_8_,(ulong)(local_120._M_allocated_capacity + 1));
        }
        local_208 = mf;
        local_1a0 = inStatus;
        bVar6 = cmConditionEvaluator::IsTrue
                          (&local_a0,
                           (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                            *)(local_1c0 + 8),&local_1e0,&local_20c);
        do {
          if (bVar6 == false) {
LAB_0029e0d2:
            if (local_a0.Backtrace.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_a0.Backtrace.TopEntry.
                         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0.ExecutionContext.FilePath._M_dataplus._M_p !=
                &local_a0.ExecutionContext.FilePath.field_2) {
              operator_delete(local_a0.ExecutionContext.FilePath._M_dataplus._M_p,
                              local_a0.ExecutionContext.FilePath.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0.ExecutionContext.Name._M_dataplus._M_p !=
                &local_a0.ExecutionContext.Name.field_2) {
              operator_delete(local_a0.ExecutionContext.Name._M_dataplus._M_p,
                              local_a0.ExecutionContext.Name.field_2._M_allocated_capacity + 1);
            }
            if ((undefined1 *)local_e8._32_8_ != local_e8 + 0x30) {
              operator_delete((void *)local_e8._32_8_,
                              CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]
                                      ) + 1);
            }
            if ((_Base_ptr)local_e8._0_8_ != (_Base_ptr)(local_e8 + 0x10)) {
              operator_delete((void *)local_e8._0_8_,CONCAT71(local_e8._17_7_,local_e8[0x10]) + 1);
            }
            if (local_158 != (_Base_ptr)local_148) {
              operator_delete(local_158,
                              (ulong)((long)&(local_148[0]->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start + 1));
            }
            if ((_Elt_pointer)local_178._0_8_ != (_Elt_pointer)(local_188 + 0x20)) {
              operator_delete((void *)local_178._0_8_,
                              (ulong)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)local_168._0_8_)->_M_impl).super__Vector_impl_data
                                     + 1));
            }
            std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
            ~vector((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *
                    )(local_1c0 + 8));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
              operator_delete(local_1e0._M_dataplus._M_p,
                              CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                                       local_1e0.field_2._M_local_buf[0]) + 1);
            }
            if ((_Map_pointer)local_1c0._0_8_ == (_Map_pointer)0x0) {
              return bVar10;
            }
            (*(code *)(*(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         **)local_1c0._0_8_)[1].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)();
            return bVar10;
          }
          if (local_1e0._M_string_length != 0) {
            local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_200,"had incorrect arguments: ","");
            pcVar2 = (this->Args).
                     super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            for (pcVar8 = (this->Args).
                          super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                          ._M_impl.super__Vector_impl_data._M_start; pcVar8 != pcVar2;
                pcVar8 = pcVar8 + 1) {
              std::__cxx11::string::append((char *)&local_200);
              std::__cxx11::string::_M_append
                        ((char *)&local_200,(ulong)(pcVar8->Value)._M_dataplus._M_p);
              std::__cxx11::string::append((char *)&local_200);
              std::__cxx11::string::append((char *)&local_200);
            }
            std::__cxx11::string::append((char *)&local_200);
            std::__cxx11::string::_M_append((char *)&local_200,(ulong)local_1e0._M_dataplus._M_p);
            std::__cxx11::string::append((char *)&local_200);
            cmMakefile::IssueMessage(local_208,local_20c,&local_200);
            if (local_20c == FATAL_ERROR) {
              cmSystemTools::s_FatalErrorOccured = true;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_200._M_dataplus._M_p != &local_200.field_2) {
                operator_delete(local_200._M_dataplus._M_p,
                                local_200.field_2._M_allocated_capacity + 1);
              }
              goto LAB_0029e0d2;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_200._M_dataplus._M_p != &local_200.field_2) {
              operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1
                             );
            }
          }
          pcVar3 = (this->Functions).
                   super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (lff_00 = (this->Functions).
                        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                        _M_impl.super__Vector_impl_data._M_start; lff_00 != pcVar3;
              lff_00 = lff_00 + 1) {
            local_200._M_dataplus._M_p = local_200._M_dataplus._M_p & 0xffffffff00000000;
            cmMakefile::ExecuteCommand(local_208,lff_00,(cmExecutionStatus *)&local_200);
            if ((char)local_200._M_dataplus._M_p == '\x01') {
              local_1a0->ReturnInvoked = true;
              goto LAB_0029e0d2;
            }
            if (local_200._M_dataplus._M_p._1_1_ != '\0') goto LAB_0029e0d2;
            if (local_200._M_dataplus._M_p._2_1_ != '\0') break;
            if ((cmSystemTools::s_FatalErrorOccured != false) ||
               (bVar6 = cmSystemTools::GetInterruptFlag(), bVar6)) goto LAB_0029e0d2;
          }
          pvVar5 = pvStack_1b0;
          if (pvStack_1b0 != (_Elt_pointer)local_1c0._8_8_) {
            local_198 = (_Elt_pointer)local_1c0._8_8_;
            ppbVar9 = &(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_1c0._8_8_)->_M_impl).super__Vector_impl_data._M_end_of_storage;
            do {
              if ((pointer)ppbVar9 != ((_Vector_impl_data *)(ppbVar9 + -2))->_M_start) {
                operator_delete(((_Vector_impl_data *)(ppbVar9 + -2))->_M_start,
                                (ulong)((long)&((*ppbVar9)->_M_dataplus)._M_p + 1));
              }
              plVar4 = (long *)(ppbVar9 + 3);
              ppbVar9 = ppbVar9 + 5;
            } while ((_Elt_pointer)plVar4 != pvVar5);
            pvStack_1b0 = local_198;
          }
          cmMakefile::ExpandArguments
                    (local_208,local_190,
                     (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      *)(local_1c0 + 8),(char *)0x0);
          bVar6 = cmConditionEvaluator::IsTrue
                            (&local_a0,
                             (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                              *)(local_1c0 + 8),&local_1e0,&local_20c);
        } while( true );
      }
      this->Depth = this->Depth + -1;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmWhileFunctionBlocker::IsFunctionBlocked(const cmListFileFunction& lff,
                                               cmMakefile& mf,
                                               cmExecutionStatus& inStatus)
{
  // at end of for each execute recorded commands
  if (lff.Name.Lower == "while") {
    // record the number of while commands past this one
    this->Depth++;
  } else if (lff.Name.Lower == "endwhile") {
    // if this is the endwhile for this while loop then execute
    if (!this->Depth) {
      // Remove the function blocker for this scope or bail.
      std::unique_ptr<cmFunctionBlocker> fb(
        mf.RemoveFunctionBlocker(this, lff));
      if (!fb) {
        return false;
      }

      std::string errorString;

      std::vector<cmExpandedCommandArgument> expandedArguments;
      mf.ExpandArguments(this->Args, expandedArguments);
      MessageType messageType;

      cmListFileContext execContext = this->GetStartingContext();

      cmCommandContext commandContext;
      commandContext.Line = execContext.Line;
      commandContext.Name = execContext.Name;

      cmConditionEvaluator conditionEvaluator(mf, this->GetStartingContext(),
                                              mf.GetBacktrace(commandContext));

      bool isTrue =
        conditionEvaluator.IsTrue(expandedArguments, errorString, messageType);

      while (isTrue) {
        if (!errorString.empty()) {
          std::string err = "had incorrect arguments: ";
          for (cmListFileArgument const& arg : this->Args) {
            err += (arg.Delim ? "\"" : "");
            err += arg.Value;
            err += (arg.Delim ? "\"" : "");
            err += " ";
          }
          err += "(";
          err += errorString;
          err += ").";
          mf.IssueMessage(messageType, err);
          if (messageType == MessageType::FATAL_ERROR) {
            cmSystemTools::SetFatalErrorOccured();
            return true;
          }
        }

        // Invoke all the functions that were collected in the block.
        for (cmListFileFunction const& fn : this->Functions) {
          cmExecutionStatus status;
          mf.ExecuteCommand(fn, status);
          if (status.GetReturnInvoked()) {
            inStatus.SetReturnInvoked();
            return true;
          }
          if (status.GetBreakInvoked()) {
            return true;
          }
          if (status.GetContinueInvoked()) {
            break;
          }
          if (cmSystemTools::GetFatalErrorOccured()) {
            return true;
          }
        }
        expandedArguments.clear();
        mf.ExpandArguments(this->Args, expandedArguments);
        isTrue = conditionEvaluator.IsTrue(expandedArguments, errorString,
                                           messageType);
      }
      return true;
    }
    // decrement for each nested while that ends
    this->Depth--;
  }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}